

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genTupleStructConstructors_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this)

{
  size_t sVar1;
  TDNode *__rhs;
  Attribute *pAVar2;
  View *pVVar3;
  CppGenerator *pCVar4;
  CppGenerator *this_00;
  string *psVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  ulong local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string attrConstruct;
  string attrAssign;
  string local_f8;
  string local_d8;
  string *local_b8;
  string tupleStruct;
  string local_90;
  undefined1 local_70 [32];
  string local_50;
  
  offset_abi_cxx11_(&local_1c0,this,0);
  std::operator+(&local_1a0,&local_1c0,"#include \"DataHandler.h\"\n");
  std::operator+(&local_158,&local_1a0,"#include <boost/spirit/include/qi.hpp>\n");
  std::operator+(&local_1e0,&local_158,"#include <boost/spirit/include/phoenix_core.hpp>\n");
  std::operator+(&local_178,&local_1e0,"#include <boost/spirit/include/phoenix_operator.hpp>\n\n");
  std::operator+(&attrAssign,&local_178,"namespace qi = boost::spirit::qi;\n");
  std::operator+(&attrConstruct,&attrAssign,"namespace phoenix = boost::phoenix;\n\n");
  std::operator+(&tupleStruct,&attrConstruct,"namespace lmfao\n{\n");
  std::__cxx11::string::~string((string *)&attrConstruct);
  std::__cxx11::string::~string((string *)&attrAssign);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string((string *)&attrConstruct,"",(allocator *)&attrAssign);
  local_b8 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&attrAssign,"",(allocator *)&local_178);
  uVar6 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= uVar6) break;
    local_180 = uVar6;
    __rhs = TreeDecomposition::getRelation
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,uVar6);
    offset_abi_cxx11_(&local_1e0,this,2);
    std::operator+(&local_178,&local_1e0,"qi::phrase_parse(tuple.begin(),tuple.end(),");
    std::__cxx11::string::operator=((string *)&attrConstruct,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1e0);
    for (uVar6 = 0; uVar6 != 100; uVar6 = uVar6 + 1) {
      if (((__rhs->_bag).super__Base_bitset<2UL>._M_w[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0) {
        pAVar2 = TreeDecomposition::getAttribute
                           ((this->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,uVar6);
        if ((pAVar2->_constant).first == false) {
          offset_abi_cxx11_(&local_d8,this,3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,"\n",&local_d8);
          pCVar4 = (CppGenerator *)local_70;
          std::operator+(&local_1c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,"qi::");
          typeToStr_abi_cxx11_(&local_f8,pCVar4,pAVar2->_type);
          std::operator+(&local_1a0,&local_1c0,&local_f8);
          std::operator+(&local_158,&local_1a0,"_[phoenix::ref(");
          std::operator+(&local_1e0,&local_158,&pAVar2->_name);
          std::operator+(&local_178,&local_1e0,") = qi::_1]>>");
          std::__cxx11::string::append((string *)&attrConstruct);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)local_70);
          std::__cxx11::string::~string((string *)&local_d8);
        }
      }
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::pop_back();
    offset_abi_cxx11_(&local_1a0,this,3);
    std::operator+(&local_158,",\n",&local_1a0);
    uVar6 = local_180;
    std::operator+(&local_1e0,&local_158,"\'|\');\n");
    offset_abi_cxx11_(&local_1c0,this,1);
    std::operator+(&local_178,&local_1e0,&local_1c0);
    std::__cxx11::string::append((string *)&attrConstruct);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_1a0);
    offset_abi_cxx11_(&local_90,this,1);
    std::operator+(&local_f8,&local_90,&__rhs->_name);
    std::operator+(&local_d8,&local_f8,"_tuple::");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &local_d8,&__rhs->_name);
    std::operator+(&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   "_tuple(const std::string& tuple)\n");
    offset_abi_cxx11_(&local_50,this,1);
    std::operator+(&local_1a0,&local_1c0,&local_50);
    std::operator+(&local_158,&local_1a0,"{\n");
    std::operator+(&local_1e0,&local_158,&attrConstruct);
    std::operator+(&local_178,&local_1e0,"}\n\n");
    std::__cxx11::string::append((string *)&tupleStruct);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_90);
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  while( true ) {
    sVar1 = QueryCompiler::numberOfViews
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    psVar5 = local_b8;
    if (sVar1 <= uVar6) break;
    local_180 = uVar6;
    pVVar3 = QueryCompiler::getView
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,uVar6);
    std::__cxx11::string::assign((char *)&attrConstruct);
    std::__cxx11::string::assign((char *)&attrAssign);
    for (pCVar4 = (CppGenerator *)0x0; pCVar4 != (CppGenerator *)0x64;
        pCVar4 = (CppGenerator *)((long)&(pCVar4->super_CodeGenerator)._vptr_CodeGenerator + 1)) {
      if (((pVVar3->_fVars).super__Base_bitset<2UL>._M_w[(ulong)pCVar4 >> 6] >>
           ((ulong)pCVar4 & 0x3f) & 1) != 0) {
        this_00 = pCVar4;
        pAVar2 = TreeDecomposition::getAttribute
                           ((this->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,(size_t)pCVar4);
        typeToStr_abi_cxx11_(&local_1c0,this_00,pAVar2->_type);
        std::operator+(&local_1a0,"const ",&local_1c0);
        std::operator+(&local_158,&local_1a0,"& ");
        psVar5 = &pAVar2->_name;
        std::operator+(&local_1e0,&local_158,psVar5);
        std::operator+(&local_178,&local_1e0,",");
        std::__cxx11::string::append((string *)&attrConstruct);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::operator+(&local_158,psVar5,"(");
        std::operator+(&local_1e0,&local_158,psVar5);
        std::operator+(&local_178,&local_1e0,"),");
        std::__cxx11::string::append((string *)&attrAssign);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_158);
      }
    }
    if (attrConstruct._M_string_length == 0) {
      offset_abi_cxx11_(&local_1c0,this,1);
      uVar6 = local_180;
      std::operator+(&local_1a0,&local_1c0,this->viewName + local_180);
      std::operator+(&local_158,&local_1a0,"_tuple::");
      std::operator+(&local_1e0,&local_158,this->viewName + uVar6);
      std::operator+(&local_178,&local_1e0,"_tuple(){}\n\n");
      psVar5 = &local_1c0;
      std::__cxx11::string::append((string *)&tupleStruct);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_1a0);
    }
    else {
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
      offset_abi_cxx11_(&local_90,this,1);
      uVar6 = local_180;
      std::operator+(&local_f8,&local_90,this->viewName + local_180);
      std::operator+(&local_d8,&local_f8,"_tuple::");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     &local_d8,this->viewName + uVar6);
      std::operator+(&local_1c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "_tuple(");
      std::operator+(&local_1a0,&local_1c0,&attrConstruct);
      std::operator+(&local_158,&local_1a0,") : ");
      std::operator+(&local_1e0,&local_158,&attrAssign);
      std::operator+(&local_178,&local_1e0,"{}\n\n");
      std::__cxx11::string::append((string *)&tupleStruct);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)local_70);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      psVar5 = &local_90;
    }
    std::__cxx11::string::~string((string *)psVar5);
    uVar6 = uVar6 + 1;
  }
  std::operator+(local_b8,&tupleStruct,"}\n");
  std::__cxx11::string::~string((string *)&attrAssign);
  std::__cxx11::string::~string((string *)&attrConstruct);
  std::__cxx11::string::~string((string *)&tupleStruct);
  return psVar5;
}

Assistant:

std::string CppGenerator::genTupleStructConstructors()
{
    std::string tupleStruct = offset(0)+"#include \"DataHandler.h\"\n"+
        "#include <boost/spirit/include/qi.hpp>\n"+
        "#include <boost/spirit/include/phoenix_core.hpp>\n"+
        "#include <boost/spirit/include/phoenix_operator.hpp>\n\n"+
        "namespace qi = boost::spirit::qi;\n"+
        "namespace phoenix = boost::phoenix;\n\n"+
        "namespace lmfao\n{\n";
    
    std::string attrConstruct = "", attrAssign = "";
    
    for (size_t relID = 0; relID < _td->numberOfRelations(); ++relID)
    {
        TDNode* rel = _td->getRelation(relID);
        const std::string& relName = rel->_name;
        const var_bitset& bag = rel->_bag;

        attrConstruct = offset(2)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
        // size_t field = 0;
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (bag[var])
            {
                Attribute* att = _td->getAttribute(var);

                if (!att->_constant.first) 
                    attrConstruct += "\n"+offset(3)+"qi::"+typeToStr(att->_type)+
                        "_[phoenix::ref("+att->_name+") = qi::_1]>>";
            }
        }
        // attrConstruct.pop_back();
        attrConstruct.pop_back();
        attrConstruct.pop_back();
        attrConstruct += ",\n"+offset(3)+"\'|\');\n"+offset(1);

        tupleStruct += offset(1)+relName+"_tuple::"+relName+
            "_tuple(const std::string& tuple)\n"+offset(1)+"{\n"+attrConstruct+"}\n\n";
    }

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);

        attrConstruct = "";
        attrAssign = "";

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* att = _td->getAttribute(var);
                attrConstruct += "const "+typeToStr(att->_type)+"& "+att->_name+",";
                attrAssign += att->_name+"("+att->_name+"),";
            }
        }        
        if (!attrConstruct.empty())
        {
            attrAssign.pop_back();
            attrConstruct.pop_back();
            
            tupleStruct +=  offset(1)+viewName[viewID]+"_tuple::"+
                viewName[viewID]+"_tuple("+attrConstruct+") : "+
                attrAssign+"{}\n\n";
        }
        else
            tupleStruct += offset(1)+viewName[viewID]+"_tuple::"+
                viewName[viewID]+"_tuple(){}\n\n";
    }
    return tupleStruct+"}\n";
}